

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

CompileInfo * __thiscall cmGeneratorTarget::GetCompileInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  string *psVar6;
  iterator iVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_bool>
  pVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string config_upper;
  CompileInfo info;
  value_type entry;
  string local_d0;
  string local_b0;
  undefined1 local_90 [64];
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  bVar3 = cmTarget::IsImported(this->Target);
  if (!bVar3) {
    TVar4 = cmTarget::GetType(this->Target);
    if ((int)TVar4 < 5) {
      paVar1 = &local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase((string *)local_90,config);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)local_90);
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
      }
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
              ::find(&(this->CompileInfoMap)._M_t,&local_d0);
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        pcVar2 = local_90 + 0x10;
        local_90._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"COMPILE_PDB","");
        ComputePDBOutputDir(this,(string *)local_90,config,&local_b0);
        if ((pointer)local_90._0_8_ != pcVar2) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::CompileInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                    *)local_90,&local_d0,(CompileInfo *)&local_b0);
        pVar8 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                ::
                _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                            *)&this->CompileInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                            *)local_90);
        iVar7._M_node = (_Base_ptr)pVar8.first._M_node;
        if ((undefined1 *)local_90._32_8_ != local_90 + 0x30) {
          operator_delete((void *)local_90._32_8_,local_90._48_8_ + 1);
        }
        if ((pointer)local_90._0_8_ != pcVar2) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      return (CompileInfo *)(iVar7._M_node + 2);
    }
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    TVar4 = cmTarget::GetType(this->Target);
    psVar6 = cmState::GetTargetTypeName_abi_cxx11_(TVar4);
    local_90._0_8_ = (pointer)0x24;
    local_90._8_8_ = "cmTarget::GetCompileInfo called for ";
    local_90._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90._32_8_ = (psVar5->_M_dataplus)._M_p;
    local_90._24_8_ = psVar5->_M_string_length;
    local_90._40_8_ = 0;
    local_90._48_8_ = 0x10;
    local_90._56_8_ = " which has type ";
    local_50 = 0;
    local_40 = (psVar6->_M_dataplus)._M_p;
    local_48 = psVar6->_M_string_length;
    local_38 = 0;
    views._M_len = 4;
    views._M_array = (iterator)local_90;
    cmCatViews(&local_d0,views);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
  }
  return (CompileInfo *)0x0;
}

Assistant:

cmGeneratorTarget::CompileInfo const* cmGeneratorTarget::GetCompileInfo(
  const std::string& config) const
{
  // There is no compile information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  if (this->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    std::string msg = cmStrCat("cmTarget::GetCompileInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->CompileInfoMap.find(config_upper);
  if (i == this->CompileInfoMap.end()) {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->CompileInfoMap.insert(entry).first;
  }
  return &i->second;
}